

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can_pbuf.c
# Opt level: O3

csp_packet_t * csp_can_pbuf_new(csp_can_interface_data_t *ifdata,uint32_t id,int *task_woken)

{
  uint32_t uVar1;
  csp_packet_t *pcVar2;
  
  csp_can_pbuf_cleanup(ifdata,task_woken);
  if (task_woken == (int *)0x0) {
    uVar1 = csp_get_ms();
    pcVar2 = csp_buffer_get_always();
  }
  else {
    uVar1 = csp_get_ms_isr();
    pcVar2 = csp_buffer_get_always_isr();
  }
  (pcVar2->field_0).field_1.last_used = uVar1;
  (pcVar2->field_0).field_0.timestamp_rx = id;
  (pcVar2->field_0).field_1.remain = 0;
  pcVar2->next = ifdata->pbufs;
  ifdata->pbufs = pcVar2;
  return pcVar2;
}

Assistant:

csp_packet_t * csp_can_pbuf_new(csp_can_interface_data_t * ifdata, uint32_t id, int * task_woken) {

	csp_can_pbuf_cleanup(ifdata, task_woken);

	uint32_t now = (task_woken) ? csp_get_ms_isr() : csp_get_ms();

	csp_packet_t * packet = (task_woken) ? csp_buffer_get_always_isr() : csp_buffer_get_always();

	packet->last_used = now;
	packet->cfpid = id;
	packet->remain = 0;

	/* Insert at beginning, because easy */
	packet->next = ifdata->pbufs;
	ifdata->pbufs = packet;

	return packet;
}